

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O2

int mbedtls_ripemd160_self_test(int verbose)

{
  uchar *input;
  int iVar1;
  size_t ilen;
  uint uVar2;
  long lVar3;
  uchar (*__s2) [20];
  uchar output [20];
  
  output[0x10] = '\0';
  output[0x11] = '\0';
  output[0x12] = '\0';
  output[0x13] = '\0';
  output[0] = '\0';
  output[1] = '\0';
  output[2] = '\0';
  output[3] = '\0';
  output[4] = '\0';
  output[5] = '\0';
  output[6] = '\0';
  output[7] = '\0';
  output[8] = '\0';
  output[9] = '\0';
  output[10] = '\0';
  output[0xb] = '\0';
  output[0xc] = '\0';
  output[0xd] = '\0';
  output[0xe] = '\0';
  output[0xf] = '\0';
  uVar2 = 1;
  __s2 = ripemd160_test_md;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x40) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  RIPEMD-160 test #%d: ",(ulong)uVar2);
    }
    input = *(uchar **)((long)ripemd160_test_input + lVar3);
    ilen = strlen((char *)input);
    mbedtls_ripemd160(input,ilen,output);
    iVar1 = bcmp(output,__s2,0x14);
    if (iVar1 != 0) break;
    if (verbose != 0) {
      puts("passed");
    }
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 8;
    __s2 = __s2 + 1;
  }
  if (verbose == 0) {
    return 1;
  }
  puts("failed");
  return 1;
}

Assistant:

int mbedtls_ripemd160_self_test( int verbose )
{
    int i;
    unsigned char output[20];

    memset( output, 0, sizeof output );

    for( i = 0; i < TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  RIPEMD-160 test #%d: ", i + 1 );

        mbedtls_ripemd160( (const unsigned char *) ripemd160_test_input[i],
                   strlen( ripemd160_test_input[i] ),
                   output );

        if( memcmp( output, ripemd160_test_md[i], 20 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}